

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

GLchar * gl4cts::ShaderSubroutine::Utils::programInterfaceToStr(GLenum program_interface)

{
  char *pcVar1;
  TestError *this;
  
  if (program_interface == 0x92e8) {
    pcVar1 = "GL_VERTEX_SUBROUTINE";
  }
  else {
    if (program_interface != 0x92ee) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x529);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pcVar1 = "GL_VERTEX_SUBROUTINE_UNIFORM";
  }
  return pcVar1;
}

Assistant:

const GLchar* Utils::programInterfaceToStr(glw::GLenum program_interface)
{
	const GLchar* string = "Unknown program interface";

	switch (program_interface)
	{
	case GL_VERTEX_SUBROUTINE:
		string = "GL_VERTEX_SUBROUTINE";
		break;
	case GL_VERTEX_SUBROUTINE_UNIFORM:
		string = "GL_VERTEX_SUBROUTINE_UNIFORM";
		break;
	default:
		TCU_FAIL("Not implemented");
		break;
	};

	return string;
}